

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManSeqEquivMerge(Gia_Man_t *p,Gia_Man_t **pPart)

{
  int iVar1;
  undefined4 *__s;
  void *__s_00;
  Gia_Rpr_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int *pClass2Repr;
  int Repr;
  int n;
  int *pClasses;
  int iObj;
  int i;
  Gia_Man_t **pPart_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  __s = (undefined4 *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  memset(__s,0xff,(long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  __s_00 = malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  memset(__s_00,0xff,(long)iVar1 << 2);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("p->pReprs == NULL && p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x127a,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
  }
  iVar1 = Gia_ManObjNum(p);
  pGVar2 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar2;
  for (pClasses._4_4_ = 0; iVar1 = Gia_ManObjNum(p), pClasses._4_4_ < iVar1;
      pClasses._4_4_ = pClasses._4_4_ + 1) {
    Gia_ObjSetRepr(p,pClasses._4_4_,0xfffffff);
  }
  *__s = 0;
  pClass2Repr._4_4_ = 0;
  do {
    if (1 < pClass2Repr._4_4_) {
      for (pClasses._4_4_ = 0; iVar1 = Gia_ManObjNum(p), pClasses._4_4_ < iVar1;
          pClasses._4_4_ = pClasses._4_4_ + 1) {
        if ((__s[pClasses._4_4_] != -1) &&
           (*(int *)((long)__s_00 + (long)(int)__s[pClasses._4_4_] * 4) == -1)) {
          *(int *)((long)__s_00 + (long)(int)__s[pClasses._4_4_] * 4) = pClasses._4_4_;
          __s[pClasses._4_4_] = 0xffffffff;
        }
      }
      for (pClasses._4_4_ = 0; iVar1 = Gia_ManObjNum(p), pClasses._4_4_ < iVar1;
          pClasses._4_4_ = pClasses._4_4_ + 1) {
        if (__s[pClasses._4_4_] != -1) {
          p->pReprs[pClasses._4_4_] =
               (Gia_Rpr_t)
               ((uint)p->pReprs[pClasses._4_4_] & 0xf0000000 |
               *(uint *)((long)__s_00 + (long)(int)__s[pClasses._4_4_] * 4) & 0xfffffff);
        }
      }
      if (__s != (undefined4 *)0x0) {
        free(__s);
      }
      if (__s_00 != (void *)0x0) {
        free(__s_00);
      }
      piVar4 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar4;
      return;
    }
    if ((pPart[pClass2Repr._4_4_]->pReprs == (Gia_Rpr_t *)0x0) ||
       (pPart[pClass2Repr._4_4_]->pNexts == (int *)0x0)) {
      __assert_fail("pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x1282,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
    }
    for (pClasses._4_4_ = 0; iVar1 = Gia_ManObjNum(pPart[pClass2Repr._4_4_]), pClasses._4_4_ < iVar1
        ; pClasses._4_4_ = pClasses._4_4_ + 1) {
      iVar1 = Gia_ObjRepr(pPart[pClass2Repr._4_4_],pClasses._4_4_);
      if (iVar1 == 0) {
        pGVar3 = Gia_ManObj(pPart[pClass2Repr._4_4_],pClasses._4_4_);
        __s[pGVar3->Value] = 0;
      }
    }
    for (pClasses._4_4_ = 1; iVar1 = Gia_ManObjNum(pPart[pClass2Repr._4_4_]), pClasses._4_4_ < iVar1
        ; pClasses._4_4_ = pClasses._4_4_ + 1) {
      iVar1 = Gia_ObjIsHead(pPart[pClass2Repr._4_4_],pClasses._4_4_);
      if (iVar1 != 0) {
        pGVar3 = Gia_ManObj(pPart[pClass2Repr._4_4_],pClasses._4_4_);
        pClass2Repr._0_4_ = pGVar3->Value;
        if (pClass2Repr._4_4_ == 1) {
          iVar1 = Gia_ObjIsHead(pPart[1],pClasses._4_4_);
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsHead(pPart[n], i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                          ,0x128b,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
          }
          for (pClasses._0_4_ = pClasses._4_4_; 0 < (int)pClasses;
              pClasses._0_4_ = Gia_ObjNext(pPart[1],(int)pClasses)) {
            pGVar3 = Gia_ManObj(pPart[1],(int)pClasses);
            if (__s[pGVar3->Value] != -1) {
              pGVar3 = Gia_ManObj(pPart[1],(int)pClasses);
              pClass2Repr._0_4_ = __s[pGVar3->Value];
            }
          }
        }
        iVar1 = Gia_ObjIsHead(pPart[pClass2Repr._4_4_],pClasses._4_4_);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsHead(pPart[n], i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0x128f,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
        }
        for (pClasses._0_4_ = pClasses._4_4_; 0 < (int)pClasses;
            pClasses._0_4_ = Gia_ObjNext(pPart[pClass2Repr._4_4_],(int)pClasses)) {
          pGVar3 = Gia_ManObj(pPart[pClass2Repr._4_4_],(int)pClasses);
          __s[pGVar3->Value] = (uint)pClass2Repr;
        }
      }
    }
    pClass2Repr._4_4_ = pClass2Repr._4_4_ + 1;
  } while( true );
}

Assistant:

void Gia_ManSeqEquivMerge( Gia_Man_t * p, Gia_Man_t * pPart[2] )
{
    int i, iObj, * pClasses    = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int n, Repr, * pClass2Repr = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // initialize equiv class representation in the big AIG
    assert( p->pReprs  == NULL && p->pNexts  == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    // map equivalences of p into classes
    pClasses[0] = 0;
    for ( n = 0; n < 2; n++ )
    {
        assert( pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL );
        for ( i = 0; i < Gia_ManObjNum(pPart[n]); i++ )
            if ( Gia_ObjRepr(pPart[n], i) == 0 )
                pClasses[Gia_ManObj(pPart[n], i)->Value] = 0;
        Gia_ManForEachClass( pPart[n], i )
        {
            Repr = Gia_ManObj(pPart[n], i)->Value;
            if ( n == 1 )
            {
                Gia_ClassForEachObj( pPart[n], i, iObj )
                    if ( pClasses[Gia_ManObj(pPart[n], iObj)->Value] != -1 )
                        Repr = pClasses[Gia_ManObj(pPart[n], iObj)->Value];
            }
            Gia_ClassForEachObj( pPart[n], i, iObj )
                pClasses[Gia_ManObj(pPart[n], iObj)->Value] = Repr;
        }
    }
    // map representatives of each class
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 && pClass2Repr[pClasses[i]] == -1 )
        {
            pClass2Repr[pClasses[i]] = i;
            pClasses[i] = -1;
        }
    // remap the remaining classes
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 )
            p->pReprs[i].iRepr = pClass2Repr[pClasses[i]];
    ABC_FREE(pClasses);
    ABC_FREE(pClass2Repr);
    // create next pointers
    p->pNexts = Gia_ManDeriveNexts( p );
}